

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumMethods.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::Builtins::registerEnumMethods(Builtins *this)

{
  shared_ptr<slang::ast::builtins::EnumFirstLastMethod> *in_stack_fffffffffffffe98;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_fffffffffffffea0;
  shared_ptr<slang::ast::SystemSubroutine> *this_00;
  bool *in_stack_fffffffffffffec0;
  KnownSystemName *in_stack_fffffffffffffec8;
  Builtins *__args;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> *in_stack_ffffffffffffff18;
  SymbolKind in_stack_ffffffffffffff24;
  Builtins *in_stack_ffffffffffffff28;
  bool local_b0 [16];
  undefined1 local_8d;
  undefined4 local_8c;
  undefined1 local_65;
  undefined4 local_64;
  undefined1 local_2d;
  undefined4 local_2c;
  
  local_2c = 0x101;
  local_2d = 1;
  std::make_shared<slang::ast::builtins::EnumFirstLastMethod,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumFirstLastMethod,void>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342dcb);
  std::shared_ptr<slang::ast::builtins::EnumFirstLastMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumFirstLastMethod> *)0x1342dd8);
  local_64 = 0x102;
  local_65 = 0;
  std::make_shared<slang::ast::builtins::EnumFirstLastMethod,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumFirstLastMethod,void>
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342e47);
  std::shared_ptr<slang::ast::builtins::EnumFirstLastMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumFirstLastMethod> *)0x1342e54);
  local_8c = 0x103;
  local_8d = 1;
  std::make_shared<slang::ast::builtins::EnumNextPrevMethod,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumNextPrevMethod,void>
            (in_stack_fffffffffffffea0,
             (shared_ptr<slang::ast::builtins::EnumNextPrevMethod> *)in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342ec3);
  std::shared_ptr<slang::ast::builtins::EnumNextPrevMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumNextPrevMethod> *)0x1342ed0);
  std::make_shared<slang::ast::builtins::EnumNextPrevMethod,slang::parsing::KnownSystemName,bool>
            (in_stack_fffffffffffffec8,local_b0);
  __args = (Builtins *)&stack0xffffffffffffff60;
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumNextPrevMethod,void>
            (in_stack_fffffffffffffea0,
             (shared_ptr<slang::ast::builtins::EnumNextPrevMethod> *)in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342f3f);
  std::shared_ptr<slang::ast::builtins::EnumNextPrevMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumNextPrevMethod> *)0x1342f4c);
  std::make_shared<slang::ast::builtins::EnumNameMethod,slang::ast::builtins::Builtins&>(__args);
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumNameMethod,void>
            (in_stack_fffffffffffffea0,
             (shared_ptr<slang::ast::builtins::EnumNameMethod> *)in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342f9d);
  std::shared_ptr<slang::ast::builtins::EnumNameMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumNameMethod> *)0x1342faa);
  this_00 = &local_f8;
  std::make_shared<slang::ast::builtins::EnumNumMethod>();
  std::shared_ptr<slang::ast::SystemSubroutine>::
  shared_ptr<slang::ast::builtins::EnumNumMethod,void>
            (this_00,(shared_ptr<slang::ast::builtins::EnumNumMethod> *)in_stack_fffffffffffffe98);
  addSystemMethod(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,in_stack_ffffffffffffff18);
  std::shared_ptr<slang::ast::SystemSubroutine>::~shared_ptr
            ((shared_ptr<slang::ast::SystemSubroutine> *)0x1342ff3);
  std::shared_ptr<slang::ast::builtins::EnumNumMethod>::~shared_ptr
            ((shared_ptr<slang::ast::builtins::EnumNumMethod> *)0x1342ffd);
  return;
}

Assistant:

void Builtins::registerEnumMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_shared<name##Method>(__VA_ARGS__))
    REGISTER(SymbolKind::EnumType, EnumFirstLast, KnownSystemName::First, true);
    REGISTER(SymbolKind::EnumType, EnumFirstLast, KnownSystemName::Last, false);
    REGISTER(SymbolKind::EnumType, EnumNextPrev, KnownSystemName::Next, true);
    REGISTER(SymbolKind::EnumType, EnumNextPrev, KnownSystemName::Prev, false);
    REGISTER(SymbolKind::EnumType, EnumName, *this);
#undef REGISTER

    addSystemMethod(SymbolKind::EnumType, std::make_shared<EnumNumMethod>());
}